

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20poly1305.h
# Opt level: O3

void chacha20poly1305_finalize(chacha20poly1305_context_t *ctx,uint8_t *tag)

{
  size_t sVar1;
  ulong uVar2;
  uint8_t lenbuf [16];
  undefined1 local_28;
  undefined1 local_27;
  undefined1 local_26;
  undefined1 local_25;
  undefined1 local_24;
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  undefined1 local_20;
  undefined1 local_1f;
  undefined1 local_1e;
  undefined1 local_1d;
  undefined1 local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  
  uVar2 = ctx->textlen;
  if ((uVar2 & 0xf) != 0) {
    (*ctx->poly1305_update)(ctx,chacha20poly1305_encrypt_pad_zeros,0x10 - (uVar2 & 0xf));
    uVar2 = ctx->textlen;
  }
  sVar1 = ctx->aadlen;
  local_28 = (undefined1)sVar1;
  local_27 = (undefined1)(sVar1 >> 8);
  local_26 = (undefined1)(sVar1 >> 0x10);
  local_25 = (undefined1)(sVar1 >> 0x18);
  local_24 = (undefined1)(sVar1 >> 0x20);
  local_23 = (undefined1)(sVar1 >> 0x28);
  local_22 = (undefined1)(sVar1 >> 0x30);
  local_21 = (undefined1)(sVar1 >> 0x38);
  local_20 = (undefined1)uVar2;
  local_1f = (undefined1)(uVar2 >> 8);
  local_1e = (undefined1)(uVar2 >> 0x10);
  local_1d = (undefined1)(uVar2 >> 0x18);
  local_1c = (undefined1)(uVar2 >> 0x20);
  local_1b = (undefined1)(uVar2 >> 0x28);
  local_1a = (undefined1)(uVar2 >> 0x30);
  local_19 = (undefined1)(uVar2 >> 0x38);
  (*ctx->poly1305_update)(ctx,&local_28,0x10);
  (*ctx->poly1305_finish)(ctx,tag);
  return;
}

Assistant:

static void chacha20poly1305_finalize(struct chacha20poly1305_context_t *ctx, uint8_t *tag)
{
    uint8_t lenbuf[16];

    chacha20poly1305_encrypt_pad(ctx, ctx->textlen);

    chacha20poly1305_write_u64(lenbuf, ctx->aadlen);
    chacha20poly1305_write_u64(lenbuf + 8, ctx->textlen);
    ctx->poly1305_update(ctx, lenbuf, sizeof(lenbuf));

    ctx->poly1305_finish(ctx, tag);
}